

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int mg_dns_encode_name(mbuf *io,char *name,size_t len)

{
  size_t sVar1;
  ulong in_RAX;
  char *pcVar2;
  char *pcVar3;
  uchar n;
  undefined8 uStack_38;
  
  sVar1 = io->len;
  uStack_38 = in_RAX;
  do {
    pcVar2 = strchr(name,0x2e);
    pcVar3 = name + len;
    if (pcVar2 != (char *)0x0) {
      pcVar3 = pcVar2;
    }
    if (0x7f < (long)pcVar3 - (long)name) {
      return -1;
    }
    uStack_38 = CONCAT17((char)((long)pcVar3 - (long)name),(undefined7)uStack_38);
    mbuf_insert(io,io->len,(void *)((long)&uStack_38 + 7),1);
    mbuf_insert(io,io->len,name,uStack_38 >> 0x38);
    if (*pcVar3 == '.') {
      uStack_38 = CONCAT17(uStack_38._7_1_ + '\x01',(undefined7)uStack_38);
    }
    name = name + (uStack_38 >> 0x38);
    len = len - (uStack_38 >> 0x38);
  } while (*pcVar3 != '\0');
  mbuf_insert(io,io->len,"",1);
  return (int)io->len - (int)sVar1;
}

Assistant:

static int mg_dns_encode_name(struct mbuf *io, const char *name, size_t len) {
    const char *s;
    unsigned char n;
    size_t pos = io->len;

    do {
        if ((s = strchr(name, '.')) == NULL) {
            s = name + len;
        }

        if (s - name > 127) {
            return -1; /* TODO(mkm) cover */
        }
        n = s - name;           /* chunk length */
        mbuf_append(io, &n, 1); /* send length */
        mbuf_append(io, name, n);

        if (*s == '.') {
            n++;
        }

        name += n;
        len -= n;
    } while (*s != '\0');
    mbuf_append(io, "\0", 1); /* Mark end of host name */

    return io->len - pos;
}